

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O3

void __thiscall
despot::MemoryPool<despot::ChainState>::~MemoryPool(MemoryPool<despot::ChainState> *this)

{
  pointer ppCVar1;
  pointer ppCVar2;
  
  DeleteAll(this);
  ppCVar1 = (this->freelist_).
            super__Vector_base<despot::ChainState_*,_std::allocator<despot::ChainState_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppCVar1 != (pointer)0x0) {
    operator_delete(ppCVar1,(long)(this->freelist_).
                                  super__Vector_base<despot::ChainState_*,_std::allocator<despot::ChainState_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar1
                   );
  }
  ppCVar2 = (this->chunks_).
            super__Vector_base<despot::MemoryPool<despot::ChainState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::ChainState>::Chunk_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar2 != (pointer)0x0) {
    operator_delete(ppCVar2,(long)(this->chunks_).
                                  super__Vector_base<despot::MemoryPool<despot::ChainState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::ChainState>::Chunk_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar2
                   );
    return;
  }
  return;
}

Assistant:

~MemoryPool() {
		DeleteAll();
	}